

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O3

bool __thiscall
Diligent::BufferBase<Diligent::EngineVkImplTraits>::CheckState
          (BufferBase<Diligent::EngineVkImplTraits> *this,RESOURCE_STATE State)

{
  RESOURCE_STATE RVar1;
  string msg;
  string local_38;
  
  if ((State & State - RESOURCE_STATE_UNDEFINED) != RESOURCE_STATE_UNKNOWN) {
    FormatString<char[25]>(&local_38,(char (*) [25])"Single state is expected");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CheckState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0xef);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  RVar1 = this->m_State;
  if (RVar1 == RESOURCE_STATE_UNKNOWN) {
    FormatString<char[24]>(&local_38,(char (*) [24])"Buffer state is unknown");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CheckState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0xf0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    RVar1 = this->m_State;
  }
  return (State & ~RVar1) == RESOURCE_STATE_UNKNOWN;
}

Assistant:

bool CheckState(RESOURCE_STATE State) const
    {
        DEV_CHECK_ERR((State & (State - 1)) == 0, "Single state is expected");
        DEV_CHECK_ERR(IsInKnownState(), "Buffer state is unknown");
        return (this->m_State & State) == State;
    }